

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildProfiled2CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  bVar3 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19fd,"(OpCodeAttr::IsProfiledOp(newOpcode))",
                       "OpCodeAttr::IsProfiledOp(newOpcode)");
    if (!bVar3) goto LAB_004e0e58;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19fe,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004e0e58;
    *puVar4 = 0;
  }
  pbVar1 = (this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = pbVar1 + 0xe;
  if ((this->m_jnReader).m_endLocation < pbVar1 + 0xe) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar3) {
LAB_004e0e58:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,(int)*(short *)(pbVar1 + 1));
    DoClosureRegCheck(this,(uint)*(ushort *)(pbVar1 + 3));
  }
  BuildProfiled2CallIExtended
            (this,newOpcode,offset,(int)*(short *)(pbVar1 + 1),(uint)*(ushort *)(pbVar1 + 3),
             (ushort)*pbVar1,*(ProfileId *)(pbVar1 + 10),*(ProfileId *)(pbVar1 + 0xc),pbVar1[5],
             *(uint32 *)(pbVar1 + 6));
  return;
}

Assistant:

void
IRBuilder::BuildProfiled2CallIExtended(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOp(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile2<Js::OpLayoutT_CallIExtended<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Return);
        this->DoClosureRegCheck(layout->Function);
    }

    BuildProfiled2CallIExtended(newOpcode, offset, layout->Return, layout->Function, layout->ArgCount, layout->profileId, layout->profileId2, layout->Options, layout->SpreadAuxOffset);
}